

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O2

SVInt * __thiscall slang::SVInt::operator|=(SVInt *this,SVInt *rhs)

{
  ulong *puVar1;
  bool bVar2;
  uint uVar3;
  uint64_t *puVar4;
  uint64_t *puVar5;
  ulong uVar6;
  byte bVar7;
  SVInt *pSVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  SVInt SStack_28;
  
  uVar9 = (this->super_SVIntStorage).bitWidth;
  uVar3 = (rhs->super_SVIntStorage).bitWidth;
  if (uVar9 != uVar3) {
    if (uVar3 <= uVar9) {
      extend(&SStack_28,(bitwidth_t)rhs,SUB41(uVar9,0));
      pSVar8 = operator|=(this,&SStack_28);
      ~SVInt(&SStack_28);
      return pSVar8;
    }
    extend(&SStack_28,(bitwidth_t)this,SUB41(uVar3,0));
    operator=(this,&SStack_28);
    ~SVInt(&SStack_28);
  }
  bVar7 = (this->super_SVIntStorage).unknownFlag;
  if (((bool)bVar7 == false) && ((rhs->super_SVIntStorage).unknownFlag == true)) {
    makeUnknown(this);
    bVar7 = (this->super_SVIntStorage).unknownFlag;
  }
  uVar9 = (this->super_SVIntStorage).bitWidth;
  if (uVar9 < 0x41 && (bVar7 & 1) == 0) {
    (this->super_SVIntStorage).field_0.val =
         (this->super_SVIntStorage).field_0.val | (rhs->super_SVIntStorage).field_0.val;
  }
  else {
    uVar9 = uVar9 + 0x3f >> 6;
    if ((bVar7 & 1) == 0) {
      for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
        puVar1 = (this->super_SVIntStorage).field_0.pVal + uVar10;
        *puVar1 = *puVar1 | (rhs->super_SVIntStorage).field_0.pVal[uVar10];
      }
    }
    else {
      bVar2 = (rhs->super_SVIntStorage).unknownFlag;
      if ((rhs->super_SVIntStorage).bitWidth < 0x41 && (bVar2 & 1U) == 0) {
        puVar1 = (ulong *)((this->super_SVIntStorage).field_0.val + 8);
        *puVar1 = *puVar1 & ~(rhs->super_SVIntStorage).field_0.val;
        puVar1 = (this->super_SVIntStorage).field_0.pVal;
        *puVar1 = ((rhs->super_SVIntStorage).field_0.val | *puVar1) & ~puVar1[1];
      }
      else {
        uVar10 = (ulong)(uVar9 * 8);
        if ((bVar2 & 1U) == 0) {
          for (uVar11 = 0; uVar10 != uVar11; uVar11 = uVar11 + 8) {
            puVar1 = (ulong *)((long)(this->super_SVIntStorage).field_0.pVal + uVar11 + uVar10);
            *puVar1 = *puVar1 & ~*(ulong *)((long)(rhs->super_SVIntStorage).field_0.pVal + uVar11);
          }
        }
        else {
          for (uVar11 = 0; uVar10 != uVar11; uVar11 = uVar11 + 8) {
            puVar4 = (this->super_SVIntStorage).field_0.pVal;
            puVar5 = (rhs->super_SVIntStorage).field_0.pVal;
            uVar6 = *(ulong *)((long)puVar5 + uVar10 + uVar11);
            *(ulong *)((long)puVar4 + uVar10 + uVar11) =
                 ~*(ulong *)((long)puVar4 + uVar11) & uVar6 |
                 (~*(ulong *)((long)puVar5 + uVar11) | uVar6) &
                 *(ulong *)((long)puVar4 + uVar10 + uVar11);
          }
        }
        for (uVar10 = 0; uVar9 << 3 != uVar10; uVar10 = uVar10 + 8) {
          puVar4 = (this->super_SVIntStorage).field_0.pVal;
          *(ulong *)((long)puVar4 + uVar10) =
               (*(ulong *)((long)(rhs->super_SVIntStorage).field_0.pVal + uVar10) |
               *(ulong *)((long)puVar4 + uVar10)) &
               ~*(ulong *)((long)puVar4 + (uVar9 << 3) + uVar10);
        }
      }
    }
  }
  clearUnusedBits(this);
  checkUnknown(this);
  return this;
}

Assistant:

SVInt& SVInt::operator|=(const SVInt& rhs) {
    if (bitWidth != rhs.bitWidth) {
        bool bothSigned = signFlag && rhs.signFlag;
        if (bitWidth < rhs.bitWidth)
            *this = extend(rhs.bitWidth, bothSigned);
        else
            return *this |= rhs.extend(bitWidth, bothSigned);
    }

    if (!hasUnknown() && rhs.hasUnknown())
        makeUnknown();

    if (isSingleWord())
        val |= rhs.val;
    else {
        uint32_t words = getNumWords(bitWidth, false);
        if (unknownFlag) {
            if (rhs.isSingleWord()) {
                pVal[1] &= ~rhs.val;
                pVal[0] = ~pVal[1] & (pVal[0] | rhs.val);
            }
            else {
                if (rhs.hasUnknown()) {
                    for (uint32_t i = 0; i < words; i++) {
                        pVal[i + words] = (pVal[i + words] & (rhs.pVal[i + words] | ~rhs.pVal[i])) |
                                          (~pVal[i] & rhs.pVal[i + words]);
                    }
                }
                else {
                    for (uint32_t i = 0; i < words; i++)
                        pVal[i + words] &= ~rhs.pVal[i];
                }

                for (uint32_t i = 0; i < words; i++)
                    pVal[i] = ~pVal[i + words] & (pVal[i] | rhs.pVal[i]);
            }
        }
        else {
            for (uint32_t i = 0; i < words; i++)
                pVal[i] |= rhs.pVal[i];
        }
    }
    clearUnusedBits();
    checkUnknown();
    return *this;
}